

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaLoader.cpp
# Opt level: O1

string * __thiscall
Assimp::ColladaLoader::FindNameForNode_abi_cxx11_
          (string *__return_storage_ptr__,ColladaLoader *this,Node *pNode)

{
  size_type sVar1;
  pointer pcVar2;
  ostringstream local_190 [112];
  ios_base local_120 [264];
  
  if (this->useColladaName == true) {
    sVar1 = (pNode->mName)._M_string_length;
    if (sVar1 == 0) {
      std::__cxx11::ostringstream::ostringstream(local_190);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_190,"$ColladaAutoName$_",0x12);
      this->mNodeNameCounter = this->mNodeNameCounter + 1;
      std::ostream::_M_insert<unsigned_long>((ulong)local_190);
      std::__cxx11::stringbuf::str();
LAB_00400cd0:
      std::__cxx11::ostringstream::~ostringstream(local_190);
      std::ios_base::~ios_base(local_120);
      return __return_storage_ptr__;
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = (pNode->mName)._M_dataplus._M_p;
  }
  else {
    sVar1 = (pNode->mID)._M_string_length;
    if (sVar1 == 0) {
      sVar1 = (pNode->mSID)._M_string_length;
      if (sVar1 == 0) {
        std::__cxx11::ostringstream::ostringstream(local_190);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_190,"$ColladaAutoName$_",0x12);
        this->mNodeNameCounter = this->mNodeNameCounter + 1;
        std::ostream::_M_insert<unsigned_long>((ulong)local_190);
        std::__cxx11::stringbuf::str();
        goto LAB_00400cd0;
      }
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar2 = (pNode->mSID)._M_dataplus._M_p;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar2 = (pNode->mID)._M_dataplus._M_p;
    }
  }
  std::__cxx11::string::_M_construct<char*>((string *)__return_storage_ptr__,pcVar2,pcVar2 + sVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string ColladaLoader::FindNameForNode(const Collada::Node* pNode)
{
    // If explicitly requested, just use the collada name.
    if (useColladaName)
    {
        if (!pNode->mName.empty()) {
            return pNode->mName;
        }
        else {
            return format() << "$ColladaAutoName$_" << mNodeNameCounter++;
        }
    }
    else
    {
        // Now setup the name of the assimp node. The collada name might not be
        // unique, so we use the collada ID.
        if (!pNode->mID.empty())
            return pNode->mID;
        else if (!pNode->mSID.empty())
            return pNode->mSID;
        else
        {
            // No need to worry. Unnamed nodes are no problem at all, except
            // if cameras or lights need to be assigned to them.
            return format() << "$ColladaAutoName$_" << mNodeNameCounter++;
        }
    }
}